

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall
asCoeffAndRest_sumCompare_Test::~asCoeffAndRest_sumCompare_Test
          (asCoeffAndRest_sumCompare_Test *this)

{
  asCoeffAndRest_sumCompare_Test *this_local;
  
  ~asCoeffAndRest_sumCompare_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(asCoeffAndRest, sumCompare)
{
    auto const n2 = 2_i;
    auto const x = symbol("x");
    auto const y = symbol("y");

    auto const e = n2 * x + y;
    auto const sum = std::get<mathiu::impl::Sum>(*e);

    EXPECT_NE(sum.find(x), sum.end());
}